

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O1

void mul_mat_f32_naive(float *src0,float *src1,float *dst,int m,int n,int k)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  
  if (0 < m) {
    uVar3 = 0;
    uVar6 = 0;
    do {
      if (0 < n) {
        uVar4 = 0;
        pfVar5 = src1;
        do {
          auVar7 = ZEXT1664(ZEXT816(0) << 0x40);
          if (0 < k) {
            uVar2 = 0;
            do {
              auVar1 = vfmadd231ss_fma(auVar7._0_16_,ZEXT416((uint)src0[uVar3 + uVar2]),
                                       ZEXT416((uint)pfVar5[uVar2]));
              auVar7 = ZEXT1664(auVar1);
              uVar2 = uVar2 + 1;
            } while ((uint)k != uVar2);
          }
          dst[uVar6 * (uint)n + uVar4] = auVar7._0_4_;
          uVar4 = uVar4 + 1;
          pfVar5 = pfVar5 + (uint)k;
        } while (uVar4 != (uint)n);
      }
      uVar6 = uVar6 + 1;
      uVar3 = (ulong)(uint)((int)uVar3 + k);
    } while (uVar6 != (uint)m);
  }
  return;
}

Assistant:

void mul_mat_f32_naive(
    const float * restrict src0, // M x K
    const float * restrict src1, // N x K (transposed)
    float * dst,
    int m, int n, int k) {
    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            float sum = 0;
            for (int l = 0; l < k; l++) {
                sum += src0[i*k + l] * src1[j*k + l];
            }
            dst[i*n + j] = sum;
        }
    }
}